

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.cpp
# Opt level: O3

size_t helics::detail::convertToBinary(byte *data,complex<double> *val,size_t size)

{
  data[0] = 0x62;
  data[1] = 0;
  data[2] = 0;
  data[3] = 0;
  data[4] = 0;
  data[5] = 0;
  data[6] = 0;
  data[7] = 0;
  data[4] = (byte)(size >> 0x18);
  data[5] = (byte)(size >> 0x10);
  data[6] = (byte)(size >> 8);
  data[7] = (byte)size;
  memcpy(data + 8,val,size << 4);
  return size << 4 | 8;
}

Assistant:

size_t convertToBinary(std::byte* data, const std::complex<double>* val, size_t size)
{
    addCodeAndSize(data, cvCode, size);
    std::memcpy(data + 8, val, size * sizeof(double) * 2);
    return size * sizeof(double) * 2U + 8U;
}